

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O0

double aom_normalized_cross_correlation(double *a,double *b,int n)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  int i;
  double b_len;
  double a_len;
  double c;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  local_20 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    local_28 = *(double *)(in_RDI + (long)local_34 * 8) * *(double *)(in_RDI + (long)local_34 * 8) +
               local_28;
    local_30 = *(double *)(in_RSI + (long)local_34 * 8) * *(double *)(in_RSI + (long)local_34 * 8) +
               local_30;
    local_20 = *(double *)(in_RDI + (long)local_34 * 8) * *(double *)(in_RSI + (long)local_34 * 8) +
               local_20;
  }
  dVar1 = sqrt(local_28);
  dVar2 = sqrt(local_30);
  return local_20 / (dVar1 * dVar2);
}

Assistant:

double aom_normalized_cross_correlation(const double *a, const double *b,
                                        int n) {
  double c = 0;
  double a_len = 0;
  double b_len = 0;
  for (int i = 0; i < n; ++i) {
    a_len += a[i] * a[i];
    b_len += b[i] * b[i];
    c += a[i] * b[i];
  }
  return c / (sqrt(a_len) * sqrt(b_len));
}